

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

boolean dig_corridor(level *lev,coord *org,coord *dest,boolean nxcor,schar ftyp,schar btyp)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int local_70;
  bool local_69;
  int i_1;
  boolean rightok;
  boolean leftok;
  int i;
  boolean downok;
  boolean upok;
  int ddy;
  int ddx;
  int yy;
  int xx;
  int ty;
  int tx;
  rm *crm;
  int cct;
  int diy;
  int dix;
  int dy;
  int dx;
  schar btyp_local;
  schar ftyp_local;
  boolean nxcor_local;
  coord *dest_local;
  coord *org_local;
  level *lev_local;
  
  dix = 0;
  diy = 0;
  iVar3 = (int)org->x;
  iVar4 = (int)org->y;
  uVar5 = (uint)dest->x;
  uVar6 = (uint)dest->y;
  if ((((((iVar3 < 1) || (iVar4 < 1)) || ((int)uVar5 < 1)) || (((int)uVar6 < 1 || (0x4f < iVar3))))
      || (0x4f < (int)uVar5)) || ((0x14 < iVar4 || (0x14 < (int)uVar6)))) {
    lev_local._7_1_ = '\0';
  }
  else {
    if (iVar3 < (int)uVar5) {
      dix = 1;
    }
    else if (iVar4 < (int)uVar6) {
      diy = 1;
    }
    else if ((int)uVar5 < iVar3) {
      dix = -1;
    }
    else {
      diy = -1;
    }
    ddx = iVar3 - dix;
    ddy = iVar4 - diy;
    crm._0_4_ = 0;
    while (ddx != uVar5 || ddy != uVar6) {
      uVar7 = (uint)crm + 1;
      if ((500 < (int)(uint)crm) || ((nxcor != '\0' && (iVar3 = rn2(0x23), iVar3 == 0)))) {
        if (nxcor == '\0') {
          warning("dig_corridor: giving up after %d tries",(ulong)(uint)crm);
        }
        return '\0';
      }
      ddx = dix + ddx;
      ddy = diy + ddy;
      if ((((0x4e < ddx) || (ddx < 1)) || (ddy < 1)) || (0x13 < ddy)) {
        if (nxcor == '\0') {
          warning("dig_corridor: hit level edge [%d,%d]",(ulong)(uint)ddx,(ulong)(uint)ddy);
        }
        return '\0';
      }
      if (lev->locations[ddx][ddy].typ == btyp) {
        if ((ftyp == '\x18') && (iVar3 = rn2(100), iVar3 == 0)) {
          lev->locations[ddx][ddy].typ = '\x18';
        }
        else {
          lev->locations[ddx][ddy].typ = ftyp;
          if ((nxcor != '\0') && (iVar3 = rn2(0x32), iVar3 == 0)) {
            mksobj_at(0x214,lev,ddx,ddy,'\x01','\0');
          }
        }
      }
      else if ((lev->locations[ddx][ddy].typ != ftyp) && (lev->locations[ddx][ddy].typ != '\x10')) {
        if (nxcor == '\0') {
          warning("dig_corridor: trying to dig disallowed tile [%d,%d]",(ulong)(uint)ddx,
                  (ulong)(uint)ddy);
        }
        return '\0';
      }
      iVar3 = ddx - uVar5;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      iVar4 = ddy - uVar6;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      crm._0_4_ = uVar7;
      if ((diy == 0) ||
         (((iVar3 <= iVar4 && ((-1 < diy || ((int)uVar6 <= ddy)))) &&
          ((diy < 1 || (ddy <= (int)uVar6)))))) {
        if ((dix == 0) ||
           (((iVar4 <= iVar3 && ((-1 < dix || ((int)uVar5 <= ddx)))) &&
            ((dix < 1 || (ddx <= (int)uVar5)))))) goto LAB_002e09f0;
        iVar3 = 1;
        if ((int)uVar6 < ddy) {
          iVar3 = -1;
        }
        iVar4 = ddy + iVar3;
        if (((lev->locations[ddx][iVar4].typ != btyp) && (lev->locations[ddx][iVar4].typ != ftyp))
           && (lev->locations[ddx][iVar4].typ != '\x10')) goto LAB_002e09f0;
        dix = 0;
        diy = iVar3;
      }
      else {
        iVar3 = 1;
        if ((int)uVar5 < ddx) {
          iVar3 = -1;
        }
        iVar4 = ddx + iVar3;
        if (((lev->locations[iVar4][ddy].typ == btyp) || (lev->locations[iVar4][ddy].typ == ftyp))
           || (lev->locations[iVar4][ddy].typ == '\x10')) {
          diy = 0;
          dix = iVar3;
        }
        else {
LAB_002e09f0:
          iVar3 = ddx + dix;
          iVar4 = ddy + diy;
          if (((lev->locations[iVar3][iVar4].typ != btyp) &&
              (lev->locations[iVar3][iVar4].typ != ftyp)) &&
             (lev->locations[iVar3][iVar4].typ != '\x10')) {
            if (dix == 0) {
              local_69 = false;
              bVar1 = false;
              if (ddy == uVar6) {
                bVar1 = ddx <= (int)uVar5;
                local_69 = !bVar1;
              }
              else {
                local_70 = 1;
                while ((local_70 < 0x4f && ((!local_69 || (!bVar1))))) {
                  if (0 < ddx - local_70) {
                    iVar3 = ddx - local_70;
                    iVar4 = ddy + diy;
                    if (((!local_69) && (0 < (ddx - local_70) + -1)) &&
                       ((lev->locations[iVar3][iVar4].typ == btyp ||
                        ((lev->locations[iVar3][iVar4].typ == ftyp ||
                         (lev->locations[iVar3][iVar4].typ == '\x10')))))) {
                      local_69 = true;
                    }
                  }
                  if (ddx + local_70 < 0x4f) {
                    iVar3 = ddx + local_70;
                    iVar4 = ddy + diy;
                    if (((!bVar1) && (ddx + local_70 + 1 < 0x4f)) &&
                       ((lev->locations[iVar3][iVar4].typ == btyp ||
                        ((lev->locations[iVar3][iVar4].typ == ftyp ||
                         (lev->locations[iVar3][iVar4].typ == '\x10')))))) {
                      bVar1 = true;
                    }
                  }
                  local_70 = local_70 + 1;
                }
              }
              if (((nxcor == '\0') && (!local_69)) && (!bVar1)) {
                warning("dig_corridor: vertical corridor blocked");
              }
              if ((ddx <= (int)uVar5) || (bVar2 = true, !local_69)) {
                bVar2 = (bool)(bVar1 ^ 1);
              }
              dix = 1;
              if (bVar2) {
                dix = -1;
              }
              diy = 0;
            }
            else {
              leftok = false;
              bVar1 = false;
              if (ddx == uVar5) {
                bVar1 = ddy <= (int)uVar6;
                leftok = !bVar1;
              }
              else {
                i_1 = 1;
                while ((i_1 < 0x14 && ((!(bool)leftok || (!bVar1))))) {
                  if (0 < ddy - i_1) {
                    iVar3 = ddx + dix;
                    iVar4 = ddy - i_1;
                    if (((!(bool)leftok) && (0 < (ddy - i_1) + -1)) &&
                       ((lev->locations[iVar3][iVar4].typ == btyp ||
                        ((lev->locations[iVar3][iVar4].typ == ftyp ||
                         (lev->locations[iVar3][iVar4].typ == '\x10')))))) {
                      leftok = true;
                    }
                  }
                  if (ddy + i_1 < 0x14) {
                    iVar3 = ddx + dix;
                    iVar4 = ddy + i_1;
                    if (((!bVar1) && (ddy + i_1 + 1 < 0x14)) &&
                       ((lev->locations[iVar3][iVar4].typ == btyp ||
                        ((lev->locations[iVar3][iVar4].typ == ftyp ||
                         (lev->locations[iVar3][iVar4].typ == '\x10')))))) {
                      bVar1 = true;
                    }
                  }
                  i_1 = i_1 + 1;
                }
              }
              if (((nxcor == '\0') && (!(bool)leftok)) && (!bVar1)) {
                warning("dig_corridor: horizontal corridor blocked");
              }
              dix = 0;
              if ((ddy <= (int)uVar6) || (bVar2 = true, !(bool)leftok)) {
                bVar2 = (bool)(bVar1 ^ 1);
              }
              diy = 1;
              if (bVar2) {
                diy = -1;
              }
            }
            iVar3 = ddx + dix;
            iVar4 = ddy + diy;
            if (((lev->locations[iVar3][iVar4].typ != btyp) &&
                (lev->locations[iVar3][iVar4].typ != ftyp)) &&
               (lev->locations[iVar3][iVar4].typ != '\x10')) {
              dix = -dix;
              diy = -diy;
            }
          }
        }
      }
    }
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

boolean dig_corridor(struct level *lev, coord *org, coord *dest, boolean nxcor,
		     schar ftyp, schar btyp)
{
	int dx = 0, dy = 0, dix, diy, cct;
	struct rm *crm;
	int tx, ty, xx, yy;

	xx = org->x;
	yy = org->y;
	tx = dest->x;
	ty = dest->y;
	if (xx <= 0 || yy <= 0 || tx <= 0 || ty <= 0 ||
	    xx > COLNO - 1 || tx > COLNO - 1 ||
	    yy > ROWNO - 1 || ty > ROWNO - 1)
	    return FALSE;

	if (tx > xx)		dx = 1;
	else if (ty > yy)	dy = 1;
	else if (tx < xx)	dx = -1;
	else			dy = -1;

	xx -= dx;
	yy -= dy;
	cct = 0;
	while (xx != tx || yy != ty) {
	    /* loop: dig corridor at [xx,yy] and find new [xx,yy] */
	    if (cct++ > 500 || (nxcor && !rn2(35))) {
		if (!nxcor)
		    warning("dig_corridor: giving up after %d tries", cct - 1);
		return FALSE;
	    }

	    xx += dx;
	    yy += dy;

	    if (xx >= COLNO - 1 || xx <= 0 || yy <= 0 || yy >= ROWNO - 1) {
		/* should be impossible */
		if (!nxcor)
		    warning("dig_corridor: hit level edge [%d,%d]", xx, yy);
		return FALSE;
	    }

	    crm = &lev->locations[xx][yy];
	    if (crm->typ == btyp) {
		if (ftyp != CORR || rn2(100)) {
		    crm->typ = ftyp;
		    if (nxcor && !rn2(50))
			mksobj_at(BOULDER, lev, xx, yy, TRUE, FALSE);
		} else {
		    crm->typ = CORR;	/* formerly secret corridor */
		}
	    } else
	    if (crm->typ != ftyp && crm->typ != SCORR) {
		/* strange ... */
		if (!nxcor) {
		    warning("dig_corridor: trying to dig disallowed tile [%d,%d]",
			    xx, yy);
		}
		return FALSE;
	    }

	    /* find next corridor position */
	    dix = abs(xx-tx);
	    diy = abs(yy-ty);

	    /* do we have to change direction ? */
	    if (dy && (dix > diy ||
		       (dy < 0 && yy < ty) ||
		       (dy > 0 && yy > ty))) {
		int ddx = (xx > tx) ? -1 : 1;

		crm = &lev->locations[xx + ddx][yy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dx = ddx;
		    dy = 0;
		    continue;
		}
	    } else if (dx && (diy > dix ||
			      (dx < 0 && xx < tx) ||
			      (dx > 0 && xx > tx))) {
		int ddy = (yy > ty) ? -1 : 1;

		crm = &lev->locations[xx][yy + ddy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dy = ddy;
		    dx = 0;
		    continue;
		}
	    }

	    /* continue straight on? */
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;

	    /* no, what must we do now?? */
	    if (dx) {
		/* should we go up or down? */
		boolean upok = FALSE;
		boolean downok = FALSE;
		if (xx == tx) {
		    if (yy > ty) upok = TRUE;
		    else downok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < ROWNO - 1; i++) {
			if (upok && downok)
			    break;
			if (yy - i > 0) {
			    crm = &lev->locations[xx + dx][yy - i];
			    if (!upok &&
				yy - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				upok = TRUE;
			}
			if (yy + i < ROWNO - 1) {
			    crm = &lev->locations[xx + dx][yy + i];
			    if (!downok &&
				yy + i + 1 < ROWNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				downok = TRUE;
			}
		    }
		}
		if (!nxcor && !upok && !downok)
		    warning("dig_corridor: horizontal corridor blocked");
		dx = 0;
		dy = ((yy > ty && upok) || !downok) ? -1 : 1;
	    } else {
		/* should we go left or right? */
		boolean leftok = FALSE;
		boolean rightok = FALSE;
		if (yy == ty) {
		    if (xx > tx) leftok = TRUE;
		    else rightok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < COLNO - 1; i++) {
			if (leftok && rightok)
			    break;
			if (xx - i > 0) {
			    crm = &lev->locations[xx - i][yy + dy];
			    if (!leftok &&
				xx - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				leftok = TRUE;
			}
			if (xx + i < COLNO - 1) {
			    crm = &lev->locations[xx + i][yy + dy];
			    if (!rightok &&
				xx + i + 1 < COLNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				rightok = TRUE;
			}
		    }
		}
		if (!nxcor && !leftok && !rightok)
		    warning("dig_corridor: vertical corridor blocked");
		dx = ((xx > tx && leftok) || !rightok) ? -1 : 1;
		dy = 0;
	    }
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;
	    dy = -dy;
	    dx = -dx;
	}
	return TRUE;
}